

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitRefAs(OptimizeInstructions *this,RefAs *curr)

{
  RefAsOp RVar1;
  RefAsOp RVar2;
  ulong uVar3;
  bool bVar4;
  uintptr_t in_RAX;
  HeapType heapType;
  RefAs *this_00;
  Type local_28;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.id != 1) {
    RVar1 = curr->op;
    if (RVar1 - AnyConvertExtern < 2) {
      this_00 = (RefAs *)curr->value;
      if ((this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id ==
          RefAsId) {
        RVar2 = this_00->op;
        if (RVar2 == RefAsNonNull) {
          curr->value = this_00->value;
          RefAs::finalize(curr);
          this_00->value = (Expression *)curr;
          RefAs::finalize(this_00);
        }
        else {
          if ((RVar2 != AnyConvertExtern || RVar1 != ExternConvertAny) &&
             (RVar2 != ExternConvertAny || RVar1 != AnyConvertExtern)) {
            return;
          }
          this_00 = (RefAs *)this_00->value;
        }
LAB_00addef1:
        replaceCurrent(this,(Expression *)this_00);
        return;
      }
    }
    else {
      if (RVar1 != RefAsNonNull) {
        __assert_fail("curr->op == RefAsNonNull",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x9ef,"void wasm::OptimizeInstructions::visitRefAs(RefAs *)");
      }
      local_28.id = in_RAX;
      bVar4 = trapOnNull(this,(Expression *)curr,&curr->value);
      if (!bVar4) {
        skipNonNullCast(this,&curr->value,(Expression *)curr);
        this_00 = (RefAs *)curr->value;
        uVar3 = (this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.
                id;
        if (uVar3 < 7 || ((uint)uVar3 & 3) != 2) goto LAB_00addef1;
        if ((this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id ==
            RefCastId) {
          heapType = wasm::Type::getHeapType
                               (&(this_00->super_SpecificExpression<(wasm::Expression::Id)81>).
                                 super_Expression.type);
          wasm::Type::Type(&local_28,heapType,NonNullable,Inexact);
          (this_00->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.id =
               local_28.id;
          replaceCurrent(this,(Expression *)this_00);
        }
      }
    }
  }
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    if (curr->op == ExternConvertAny || curr->op == AnyConvertExtern) {
      // These pass nulls through, and we can reorder them with null traps:
      //
      //  (any.convert_extern/extern.convert_any (ref.as_non_null.. ))
      // =>
      //  (ref.as_non_null (any.convert_extern/extern.convert_any ..))
      //
      // By moving the RefAsNonNull outside, it may reach a position where it
      // can be optimized (e.g. if the parent traps anyhow). And,
      // ExternConvertAny/AnyConvertExtern cannot be folded with anything, so
      // there is no harm to moving them inside.
      if (auto* refAsChild = curr->value->dynCast<RefAs>()) {
        if (refAsChild->op == RefAsNonNull) {
          // Reorder and fix up the types.
          curr->value = refAsChild->value;
          curr->finalize();
          refAsChild->value = curr;
          refAsChild->finalize();
          replaceCurrent(refAsChild);
          return;
        }

        // We can optimize away externalizations of internalizations and vice
        // versa.
        if ((curr->op == ExternConvertAny &&
             refAsChild->op == AnyConvertExtern) ||
            (curr->op == AnyConvertExtern &&
             refAsChild->op == ExternConvertAny)) {
          replaceCurrent(refAsChild->value);
          return;
        }
      }
      return;
    }

    assert(curr->op == RefAsNonNull);
    if (trapOnNull(curr, curr->value)) {
      return;
    }
    skipNonNullCast(curr->value, curr);
    if (!curr->value->type.isNullable()) {
      replaceCurrent(curr->value);
      return;
    }

    // As we do in visitRefCast, ref.cast can be combined with ref.as_non_null.
    // This code handles the case where the ref.as is on the outside:
    //
    //   (ref.as_non_null (ref.cast null ..))
    // =>
    //   (ref.cast ..)
    //
    if (auto* cast = curr->value->dynCast<RefCast>()) {
      // The cast cannot be non-nullable, or we would have handled this right
      // above by just removing the ref.as, since it would not be needed.
      assert(!cast->type.isNonNullable());
      cast->type = Type(cast->type.getHeapType(), NonNullable);
      replaceCurrent(cast);
    }
  }